

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::~RandomWordTestData
          (RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> *this)

{
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_token_indexes);
  std::
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::~vector(&this->m_tokens);
  std::vector<char32_t,_std::allocator<char32_t>_>::~vector(&this->m_str);
  std::vector<char32_t,_std::allocator<char32_t>_>::~vector(&this->m_delim);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}